

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O1

bool test::ValidatePreconnectData(uint channel,uint8_t *data,uint bytes)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((channel != 0x37 || bytes != 10) || (*data != '\x06')) {
    return false;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 9) break;
    uVar1 = uVar2 + 1;
  } while (data[uVar2 + 1] == PreConnectData[uVar2 + 1]);
  return 8 < uVar2;
}

Assistant:

bool ValidatePreconnectData(unsigned channel, const uint8_t* data, unsigned bytes)
{
    if (bytes != kPreConnectDataBytes || channel != kPreConnectChannel)
        return false;

    for (unsigned i = 0; i < kPreConnectDataBytes; ++i)
        if (data[i] != PreConnectData[i])
            return false;

    return true;
}